

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::ResetEntryPoint(FunctionBody *this)

{
  Type p_Var1;
  ProxyEntryPointInfo *pPVar2;
  ScriptFunctionType **ppSVar3;
  ScriptFunctionType *pSVar4;
  FunctionBody *this_local;
  
  ClearEntryPoints(this);
  CreateNewDefaultEntryPoint(this);
  FunctionProxy::SetOriginalEntryPoint
            ((FunctionProxy *)this,InterpreterStackFrame::DelayDynamicInterpreterThunk);
  p_Var1 = (Type)((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
                 CurrentThunk;
  pPVar2 = Memory::WriteBarrierPtr<Js::ProxyEntryPointInfo>::operator->
                     (&(this->super_ParseableFunctionInfo).super_FunctionProxy.
                       m_defaultEntryPointInfo);
  pPVar2->jsMethod = p_Var1;
  ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_ScriptFunctionType__
                      ((WriteBarrierPtr *)
                       &(this->super_ParseableFunctionInfo).super_FunctionProxy.
                        deferredPrototypeType);
  if (*ppSVar3 != (ScriptFunctionType *)0x0) {
    pSVar4 = Memory::WriteBarrierPtr<Js::ScriptFunctionType>::operator->
                       (&(this->super_ParseableFunctionInfo).super_FunctionProxy.
                         deferredPrototypeType);
    pPVar2 = FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)this);
    DynamicType::SetEntryPoint(&pSVar4->super_DynamicType,(JavascriptMethod)pPVar2->jsMethod);
    pSVar4 = Memory::WriteBarrierPtr<Js::ScriptFunctionType>::operator->
                       (&(this->super_ParseableFunctionInfo).super_FunctionProxy.
                         deferredPrototypeType);
    pPVar2 = FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)this);
    ScriptFunctionType::SetEntryPointInfo(pSVar4,pPVar2);
  }
  ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_ScriptFunctionType__
                      ((WriteBarrierPtr *)
                       &(this->super_ParseableFunctionInfo).super_FunctionProxy.
                        undeferredFunctionType);
  if (*ppSVar3 != (ScriptFunctionType *)0x0) {
    pSVar4 = Memory::WriteBarrierPtr<Js::ScriptFunctionType>::operator->
                       (&(this->super_ParseableFunctionInfo).super_FunctionProxy.
                         undeferredFunctionType);
    pPVar2 = FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)this);
    DynamicType::SetEntryPoint(&pSVar4->super_DynamicType,(JavascriptMethod)pPVar2->jsMethod);
    pSVar4 = Memory::WriteBarrierPtr<Js::ScriptFunctionType>::operator->
                       (&(this->super_ParseableFunctionInfo).super_FunctionProxy.
                         undeferredFunctionType);
    pPVar2 = FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)this);
    ScriptFunctionType::SetEntryPointInfo(pSVar4,pPVar2);
  }
  ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_ScriptFunctionType__
                      ((WriteBarrierPtr *)
                       &(this->super_ParseableFunctionInfo).crossSiteDeferredFunctionType);
  if (*ppSVar3 != (ScriptFunctionType *)0x0) {
    pSVar4 = Memory::WriteBarrierPtr<Js::ScriptFunctionType>::operator->
                       (&(this->super_ParseableFunctionInfo).crossSiteDeferredFunctionType);
    pPVar2 = FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)this);
    ScriptFunctionType::SetEntryPointInfo(pSVar4,pPVar2);
  }
  ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_ScriptFunctionType__
                      ((WriteBarrierPtr *)
                       &(this->super_ParseableFunctionInfo).crossSiteUndeferredFunctionType);
  if (*ppSVar3 != (ScriptFunctionType *)0x0) {
    pSVar4 = Memory::WriteBarrierPtr<Js::ScriptFunctionType>::operator->
                       (&(this->super_ParseableFunctionInfo).crossSiteUndeferredFunctionType);
    pPVar2 = FunctionProxy::GetDefaultEntryPointInfo((FunctionProxy *)this);
    ScriptFunctionType::SetEntryPointInfo(pSVar4,pPVar2);
  }
  ReinitializeExecutionModeAndLimits(this);
  return;
}

Assistant:

void FunctionBody::ResetEntryPoint()
    {
        ClearEntryPoints();
        this->CreateNewDefaultEntryPoint();
        this->SetOriginalEntryPoint(DefaultEntryThunk);
        m_defaultEntryPointInfo->jsMethod = m_scriptContext->CurrentThunk;

        if (this->deferredPrototypeType)
        {
            // Update old entry points on the deferred prototype type,
            // as they may point to old native code gen regions which are gone now.
            this->deferredPrototypeType->SetEntryPoint(this->GetDefaultEntryPointInfo()->jsMethod);
            this->deferredPrototypeType->SetEntryPointInfo(this->GetDefaultEntryPointInfo());
        }
        if (this->undeferredFunctionType)
        {
            this->undeferredFunctionType->SetEntryPoint(this->GetDefaultEntryPointInfo()->jsMethod);
            this->undeferredFunctionType->SetEntryPointInfo(this->GetDefaultEntryPointInfo());
        }
        if (this->crossSiteDeferredFunctionType)
        {
            this->crossSiteDeferredFunctionType->SetEntryPointInfo(this->GetDefaultEntryPointInfo());
        }
        if (this->crossSiteUndeferredFunctionType)
        {
            this->crossSiteUndeferredFunctionType->SetEntryPointInfo(this->GetDefaultEntryPointInfo());
        }
        ReinitializeExecutionModeAndLimits();
    }